

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue,uint16_t fadeInMS)

{
  float fVar1;
  ushort uVar2;
  code *pcVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  FACTSoundInstance *pFVar6;
  FACTTrackInstance *pFVar7;
  FACTEventInstance *pFVar8;
  FACTEvent *pFVar9;
  FACTRPC *pFVar10;
  uint16_t in_SI;
  FACTCue *in_RDI;
  double dVar11;
  SDL_AssertState sdl_assert_state;
  FACTAudioCategory *category;
  uint8_t in_stack_0000001b;
  uint32_t in_stack_0000001c;
  uint16_t categoryIndex;
  FACTCue *wnr;
  FACTCue *tmp;
  anon_union_4_2_31d68fe4 limitmax;
  float lastX;
  FACTRPC *rpc;
  FACTSoundInstance *newSound;
  FACTSound *baseSound;
  FACTEventInstance *evtInst;
  FACTEvent *evt;
  LinkedList *list;
  FACTWaveBank *wb;
  char *wbName;
  float weight;
  float next;
  float max;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined6 in_stack_ffffffffffffff58;
  uint16_t in_stack_ffffffffffffff5e;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  FACTAudioEngine *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  uint16_t in_stack_ffffffffffffff76;
  FACTCue *in_stack_ffffffffffffff78;
  FACTCue *pFVar12;
  FACTCue *pFVar13;
  FACTCue *local_80;
  byte local_78;
  FACTSound *local_60;
  LinkedList *local_48;
  void *local_40;
  FACTEventInstance *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  undefined2 in_stack_ffffffffffffffec;
  
  local_40 = (void *)0x0;
  local_60 = (FACTSound *)0x0;
  if ((in_RDI->data->flags & 4) == 0) {
    if (((in_RDI->field_7).variation)->flags == '\x03') {
      if ((in_RDI->parentBank->parentEngine->variables[((in_RDI->field_7).variation)->variable].
           accessibility & 4) == 0) {
        FACTAudioEngine_GetGlobalVariable
                  ((FACTAudioEngine *)CONCAT26(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70),
                   (uint16_t)((ulong)in_stack_ffffffffffffff68 >> 0x30),
                   (float *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      else {
        FACTCue_GetVariable(in_stack_ffffffffffffff78,in_stack_ffffffffffffff76,
                            (float *)in_stack_ffffffffffffff68);
      }
      uVar16 = 0;
      while (((int)uVar16 < (int)(uint)((in_RDI->field_7).variation)->entryCount &&
             ((((in_RDI->field_7).variation)->entries[(int)uVar16].maxWeight <
               in_stack_ffffffffffffffd8 ||
              (in_stack_ffffffffffffffd8 <
               ((in_RDI->field_7).variation)->entries[(int)uVar16].minWeight))))) {
        uVar16 = uVar16 + 1;
      }
      if (uVar16 == ((in_RDI->field_7).variation)->entryCount) {
        return '\x01';
      }
    }
    else {
      in_stack_ffffffffffffffdc = 0.0;
      for (iVar17 = 0; iVar17 < (int)(uint)((in_RDI->field_7).variation)->entryCount;
          iVar17 = iVar17 + 1) {
        in_stack_ffffffffffffffdc =
             (((in_RDI->field_7).variation)->entries[iVar17].maxWeight -
             ((in_RDI->field_7).variation)->entries[iVar17].minWeight) + in_stack_ffffffffffffffdc;
      }
      dVar11 = stb_frand();
      in_stack_ffffffffffffffd8 = (float)dVar11 * in_stack_ffffffffffffffdc;
      uVar16 = (uint)((in_RDI->field_7).variation)->entryCount;
      for (; (uVar16 = uVar16 - 1, 0 < (int)uVar16 &&
             (in_stack_ffffffffffffffd4 =
                   ((in_RDI->field_7).variation)->entries[(int)uVar16].maxWeight -
                   ((in_RDI->field_7).variation)->entries[(int)uVar16].minWeight,
             in_stack_ffffffffffffffd8 <= in_stack_ffffffffffffffdc - in_stack_ffffffffffffffd4));
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc - in_stack_ffffffffffffffd4) {
      }
    }
    if (((in_RDI->field_7).variation)->isComplex == '\0') {
      in_stack_ffffffffffffffc8 =
           (FACTEventInstance *)
           in_RDI->parentBank->wavebankNames
           [((in_RDI->field_7).variation)->entries[(int)uVar16].field_0.simple.wavebank];
      for (local_48 = in_RDI->parentBank->parentEngine->wbList; local_48 != (LinkedList *)0x0;
          local_48 = local_48->next) {
        local_40 = local_48->entry;
        iVar17 = SDL_strcmp(in_stack_ffffffffffffffc8,*(undefined8 *)((long)local_40 + 0x28));
        if (iVar17 == 0) break;
      }
      do {
        if (local_40 != (void *)0x0) goto LAB_00118923;
        in_stack_ffffffffffffff64 =
             SDL_ReportAssertion(&FACT_INTERNAL_CreateSound::sdl_assert_data,
                                 "FACT_INTERNAL_CreateSound",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                 ,0x265);
      } while (in_stack_ffffffffffffff64 == 0);
      if (in_stack_ffffffffffffff64 == 1) {
        pcVar3 = (code *)swi(3);
        uVar4 = (*pcVar3)();
        return uVar4;
      }
LAB_00118923:
      FACTWaveBank_Prepare
                ((FACTWaveBank *)tmp,wnr._6_2_,(uint32_t)wnr,in_stack_0000001c,in_stack_0000001b,
                 (FACTWave **)category);
      in_RDI->simpleWave->parentCue = in_RDI;
    }
    else {
      for (iVar17 = 0; iVar17 < (int)(uint)in_RDI->parentBank->soundCount; iVar17 = iVar17 + 1) {
        if (((in_RDI->field_7).variation)->entries[(int)uVar16].field_0.soundCode ==
            in_RDI->parentBank->soundCodes[iVar17]) {
          local_60 = in_RDI->parentBank->sounds + iVar17;
          break;
        }
      }
    }
  }
  else {
    local_60 = (in_RDI->field_7).sound;
  }
  if (local_60 != (FACTSound *)0x0) {
    uVar2 = local_60->category;
    if (uVar2 != 0xffff) {
      in_stack_ffffffffffffff68 =
           (FACTAudioEngine *)(in_RDI->parentBank->parentEngine->categories + uVar2);
      if ((byte)in_stack_ffffffffffffff68->refcount <=
          *(byte *)((long)&in_stack_ffffffffffffff68->pReadFile + 1)) {
        pFVar12 = (FACTCue *)0x0;
        local_80 = in_RDI->parentBank->cueList;
        if (in_stack_ffffffffffffff68->field_0x6 == '\0') {
          in_RDI->state = in_RDI->state | 0x20;
          in_RDI->state = in_RDI->state & 0xffffffa7;
          return '\0';
        }
        if (in_stack_ffffffffffffff68->field_0x6 == '\x01') {
          for (; (pFVar13 = pFVar12, local_80 != (FACTCue *)0x0 &&
                 (((local_80 == in_RDI || (local_80->playingSound == (FACTSoundInstance *)0x0)) ||
                  ((local_80->playingSound->sound->category != uVar2 ||
                   (pFVar13 = local_80, (local_80->state & 0x30) != 0))))));
              local_80 = local_80->next) {
          }
        }
        else if (in_stack_ffffffffffffff68->field_0x6 == '\x02') {
          for (; (pFVar13 = pFVar12, local_80 != (FACTCue *)0x0 &&
                 ((((local_80 == in_RDI || (local_80->playingSound == (FACTSoundInstance *)0x0)) ||
                   (local_80->playingSound->sound->category != uVar2)) ||
                  (pFVar13 = local_80, (local_80->state & 0x30) != 0)))); local_80 = local_80->next)
          {
          }
        }
        else if (in_stack_ffffffffffffff68->field_0x6 == '\x03') {
          for (; pFVar13 = pFVar12, local_80 != (FACTCue *)0x0; local_80 = local_80->next) {
            if (((local_80 != in_RDI) && (local_80->playingSound != (FACTSoundInstance *)0x0)) &&
               ((local_80->playingSound->sound->category == uVar2 && ((local_80->state & 0x30) == 0)
                ))) {
              pFVar12 = local_80;
            }
          }
        }
        else {
          pFVar13 = pFVar12;
          if (in_stack_ffffffffffffff68->field_0x6 == '\x04') {
            local_78 = 0xff;
            for (; pFVar13 = pFVar12, local_80 != (FACTCue *)0x0; local_80 = local_80->next) {
              if ((((local_80 != in_RDI) && (local_80->playingSound != (FACTSoundInstance *)0x0)) &&
                  (local_80->playingSound->sound->category == uVar2)) &&
                 ((local_80->playingSound->sound->priority < local_78 &&
                  ((local_80->state & 0x30) == 0)))) {
                local_78 = local_80->playingSound->sound->priority;
                pFVar12 = local_80;
              }
            }
          }
        }
        if (pFVar13 != (FACTCue *)0x0) {
          in_SI = *(uint16_t *)((long)&in_stack_ffffffffffffff68->refcount + 2);
          if (pFVar13->playingSound == (FACTSoundInstance *)0x0) {
            FACTCue_Stop((FACTCue *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),0)
            ;
          }
          else {
            FACT_INTERNAL_BeginFadeOut
                      ((FACTSoundInstance *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5e);
          }
        }
      }
      *(char *)((long)&in_stack_ffffffffffffff68->pReadFile + 1) =
           *(char *)((long)&in_stack_ffffffffffffff68->pReadFile + 1) + '\x01';
    }
    pFVar6 = (FACTSoundInstance *)(*in_RDI->parentBank->parentEngine->pMalloc)(0x38);
    pFVar6->parentCue = in_RDI;
    pFVar6->sound = local_60;
    (pFVar6->rpcData).rpcVolume = 0.0;
    (pFVar6->rpcData).rpcPitch = 0.0;
    (pFVar6->rpcData).rpcReverbSend = 0.0;
    (pFVar6->rpcData).rpcFilterQFactor = 1.0;
    (pFVar6->rpcData).rpcFilterFreq = 1.0;
    pFVar6->fadeType = in_SI != 0;
    if (pFVar6->fadeType == '\0') {
      pFVar6->fadeStart = 0;
      pFVar6->fadeTarget = 0;
    }
    else {
      uVar5 = FAudio_timems();
      pFVar6->fadeStart = uVar5;
      pFVar6->fadeTarget = in_SI;
    }
    pFVar7 = (FACTTrackInstance *)
             (*in_RDI->parentBank->parentEngine->pMalloc)((ulong)pFVar6->sound->trackCount * 0x68);
    pFVar6->tracks = pFVar7;
    for (iVar17 = 0; iVar17 < (int)(uint)pFVar6->sound->trackCount; iVar17 = iVar17 + 1) {
      pFVar6->tracks[iVar17].rpcData.rpcVolume = 0.0;
      pFVar6->tracks[iVar17].rpcData.rpcPitch = 0.0;
      pFVar6->tracks[iVar17].rpcData.rpcReverbSend = 0.0;
      pFVar6->tracks[iVar17].rpcData.rpcFilterQFactor = 1.0;
      pFVar6->tracks[iVar17].rpcData.rpcFilterFreq = 1.0;
      pFVar6->tracks[iVar17].evtVolume = 0.0;
      pFVar6->tracks[iVar17].evtPitch = 0.0;
      pFVar6->tracks[iVar17].activeWave.wave = (FACTWave *)0x0;
      pFVar6->tracks[iVar17].activeWave.baseVolume = 0.0;
      pFVar6->tracks[iVar17].activeWave.basePitch = 0;
      pFVar6->tracks[iVar17].activeWave.baseQFactor = 1.0;
      pFVar6->tracks[iVar17].activeWave.baseFrequency = 1.0;
      pFVar6->tracks[iVar17].upcomingWave.wave = (FACTWave *)0x0;
      pFVar6->tracks[iVar17].upcomingWave.baseVolume = 0.0;
      pFVar6->tracks[iVar17].upcomingWave.basePitch = 0;
      pFVar6->tracks[iVar17].upcomingWave.baseQFactor = 1.0;
      pFVar6->tracks[iVar17].upcomingWave.baseFrequency = 1.0;
      pFVar8 = (FACTEventInstance *)
               (*in_RDI->parentBank->parentEngine->pMalloc)
                         ((ulong)pFVar6->sound->tracks[iVar17].eventCount * 0xc);
      pFVar6->tracks[iVar17].events = pFVar8;
      for (iVar15 = 0; iVar15 < (int)(uint)pFVar6->sound->tracks[iVar17].eventCount;
          iVar15 = iVar15 + 1) {
        pFVar9 = pFVar6->sound->tracks[iVar17].events + iVar15;
        pFVar6->tracks[iVar17].events[iVar15].timestamp =
             (uint)pFVar6->sound->tracks[iVar17].events[iVar15].timestamp;
        pFVar6->tracks[iVar17].events[iVar15].loopCount = 0;
        pFVar6->tracks[iVar17].events[iVar15].finished = '\0';
        pFVar6->tracks[iVar17].events[iVar15].field_3.value = 0.0;
        if (((pFVar9->type == 1) || (pFVar9->type == 3)) ||
           ((pFVar9->type == 4 || (pFVar9->type == 6)))) {
          pFVar6->tracks[iVar17].events[iVar15].loopCount =
               (ushort)pFVar6->sound->tracks[iVar17].events[iVar15].field_3.wave.loopCount;
          pFVar8 = pFVar6->tracks[iVar17].events + iVar15;
          if (((pFVar9->field_3).wave.isComplex == '\0') ||
             ((undefined1  [72])((undefined1  [72])pFVar9->field_3 & (undefined1  [72])0xf) ==
              (undefined1  [72])0x0)) {
            (pFVar8->field_3).value = 0.0;
          }
          else {
            in_stack_ffffffffffffffdc = 0.0;
            for (iVar14 = 0; iVar14 < (int)(uint)*(ushort *)((long)&pFVar9->field_3 + 10);
                iVar14 = iVar14 + 1) {
              in_stack_ffffffffffffffdc =
                   (float)*(byte *)(*(long *)((long)&pFVar9->field_3 + 0x20) + (long)iVar14) +
                   in_stack_ffffffffffffffdc;
            }
            dVar11 = stb_frand();
            in_stack_ffffffffffffffd8 = (float)dVar11 * in_stack_ffffffffffffffdc;
            in_stack_ffffffffffffffe0 = (uint)*(ushort *)((long)&pFVar9->field_3 + 10);
            while (in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 - 1,
                  -1 < (int)in_stack_ffffffffffffffe0) {
              if (in_stack_ffffffffffffffdc -
                  (float)*(byte *)(*(long *)((long)&pFVar9->field_3 + 0x20) +
                                  (long)(int)in_stack_ffffffffffffffe0) < in_stack_ffffffffffffffd8)
              {
                (pFVar8->field_3).valuei = in_stack_ffffffffffffffe0;
                break;
              }
              in_stack_ffffffffffffffdc =
                   in_stack_ffffffffffffffdc -
                   (float)*(byte *)(*(long *)((long)&pFVar9->field_3 + 0x20) +
                                   (long)(int)in_stack_ffffffffffffffe0);
            }
          }
          FACT_INTERNAL_GetNextWave
                    (in_RDI,(FACTSound *)CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,iVar17)),
                     (FACTTrack *)CONCAT44(iVar15,in_stack_ffffffffffffffe0),
                     (FACTTrackInstance *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (FACTEvent *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
          pFVar6->tracks[iVar17].waveEvt = pFVar9;
          pFVar6->tracks[iVar17].waveEvtInst = pFVar8;
        }
        else if ((pFVar9->type == 0x10) || (pFVar9->type == 0x11)) {
          pFVar6->tracks[iVar17].events[iVar15].loopCount =
               pFVar6->sound->tracks[iVar17].events[iVar15].field_3.wave.position;
        }
        else if (pFVar9->type == 0x12) {
          pFVar6->tracks[iVar17].events[iVar15].loopCount =
               pFVar6->sound->tracks[iVar17].events[iVar15].field_3.wave.angle;
        }
      }
    }
    in_RDI->maxRpcReleaseTime = 0;
    for (iVar17 = 0; iVar17 < (int)(uint)pFVar6->sound->trackCount; iVar17 = iVar17 + 1) {
      for (iVar15 = 0; iVar15 < (int)(uint)pFVar6->sound->tracks[iVar17].rpcCodeCount;
          iVar15 = iVar15 + 1) {
        pFVar10 = FACT_INTERNAL_GetRPC(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        if ((((pFVar10->parameter == 0) &&
             ((in_RDI->parentBank->parentEngine->variables[pFVar10->variable].accessibility & 4) !=
              0)) && (iVar14 = SDL_strcmp(pFVar6->parentCue->parentBank->parentEngine->variableNames
                                          [pFVar10->variable],"ReleaseTime"), iVar14 == 0)) &&
           (fVar1 = pFVar10->points[(ulong)pFVar10->pointCount - 1].x,
           (float)in_RDI->maxRpcReleaseTime < fVar1)) {
          in_RDI->maxRpcReleaseTime = (uint32_t)(long)fVar1;
        }
      }
    }
    in_RDI->playingSound = pFVar6;
  }
  return '\x01';
}

Assistant:

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue, uint16_t fadeInMS)
{
	int32_t i, j, k;
	float max, next, weight;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	FACTEvent *evt;
	FACTEventInstance *evtInst;
	FACTSound *baseSound = NULL;
	FACTSoundInstance *newSound;
	FACTRPC *rpc;
	float lastX;

	union
	{
		float maxf;
		uint8_t maxi;
	} limitmax;
	FACTCue *tmp, *wnr;
	uint16_t categoryIndex;
	FACTAudioCategory *category;

	if (cue->data->flags & 0x04)
	{
		/* Sound */
		baseSound = cue->sound;
	}
	else
	{
		/* Variation */
		if (cue->variation->flags == 3)
		{
			/* Interactive */
			if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
			{
				FACTCue_GetVariable(
					cue,
					cue->variation->variable,
					&next
				);
			}
			else
			{
				FACTAudioEngine_GetGlobalVariable(
					cue->parentBank->parentEngine,
					cue->variation->variable,
					&next
				);
			}
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				if (	next <= cue->variation->entries[i].maxWeight &&
					next >= cue->variation->entries[i].minWeight	)
				{
					break;
				}
			}

			/* This should only happen when the user control
			 * variable is none of the sound probabilities, in
			 * which case we are just silent. But, we should still
			 * claim to be "playing" in the meantime.
			 */
			if (i == cue->variation->entryCount)
			{
				return 1;
			}
		}
		else
		{
			/* Random */
			max = 0.0f;
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				max += (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
			}
			next = FACT_INTERNAL_rng() * max;

			/* Use > 0, not >= 0. If we hit 0, that's it! */
			for (i = cue->variation->entryCount - 1; i > 0; i -= 1)
			{
				weight = (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
				if (next > (max - weight))
				{
					break;
				}
				max -= weight;
			}
		}

		if (cue->variation->isComplex)
		{
			/* Grab the Sound via the code. FIXME: Do this at load time? */
			for (j = 0; j < cue->parentBank->soundCount; j += 1)
			{
				if (cue->variation->entries[i].soundCode == cue->parentBank->soundCodes[j])
				{
					baseSound = &cue->parentBank->sounds[j];
					break;
				}
			}
		}
		else
		{
			/* Pull in the WaveBank... */
			wbName = cue->parentBank->wavebankNames[
				cue->variation->entries[i].simple.wavebank
			];
			list = cue->parentBank->parentEngine->wbList;
			while (list != NULL)
			{
				wb = (FACTWaveBank*) list->entry;
				if (FAudio_strcmp(wbName, wb->name) == 0)
				{
					break;
				}
				list = list->next;
			}
			FAudio_assert(wb != NULL);

			/* Generate the wave... */
			FACTWaveBank_Prepare(
				wb,
				cue->variation->entries[i].simple.track,
				0,
				0,
				0,
				&cue->simpleWave
			);
			cue->simpleWave->parentCue = cue;
		}
	}

	/* Alloc SoundInstance variables */
	if (baseSound != NULL)
	{
		/* Category Instance Limits */
		categoryIndex = baseSound->category;
		if (categoryIndex != FACTCATEGORY_INVALID)
		{
			category = &cue->parentBank->parentEngine->categories[categoryIndex];
			if (category->instanceCount >= category->instanceLimit)
			{
				wnr = NULL;
				tmp = cue->parentBank->cueList;
				if (category->maxInstanceBehavior == 0) /* Fail */
				{
					cue->state |= FACT_STATE_STOPPED;
					cue->state &= ~(
						FACT_STATE_PLAYING |
						FACT_STATE_STOPPING |
						FACT_STATE_PAUSED
					);
					return 0;
				}
				else if (category->maxInstanceBehavior == 1) /* Queue */
				{
					/* FIXME: How is this different from Replace Oldest? */
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 2) /* Replace Oldest */
				{
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 3) /* Replace Quietest */
				{
					limitmax.maxf = FACTVOLUME_MAX;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							/*FIXME: tmp->playingSound->volume < limitmax.maxf &&*/
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							/* limitmax.maxf = tmp->playingSound->volume; */
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 4) /* Replace Lowest Priority */
				{
					limitmax.maxi = 0xFF;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							tmp->playingSound->sound->priority < limitmax.maxi &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							limitmax.maxi = tmp->playingSound->sound->priority;
						}
						tmp = tmp->next;
					}
				}
				if (wnr != NULL)
				{
					fadeInMS = category->fadeInMS;
					if (wnr->playingSound != NULL)
					{
						FACT_INTERNAL_BeginFadeOut(wnr->playingSound, category->fadeOutMS);
					}
					else
					{
						FACTCue_Stop(wnr, 0);
					}
				}
			}
			category->instanceCount += 1;
		}

		newSound = (FACTSoundInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTSoundInstance)
		);
		newSound->parentCue = cue;
		newSound->sound = baseSound;
		newSound->rpcData.rpcVolume = 0.0f;
		newSound->rpcData.rpcPitch = 0.0f;
		newSound->rpcData.rpcReverbSend = 0.0f;
		newSound->rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
		newSound->rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;
		newSound->fadeType = (fadeInMS > 0);
		if (newSound->fadeType)
		{
			newSound->fadeStart = FAudio_timems();
			newSound->fadeTarget = fadeInMS;
		}
		else
		{
			newSound->fadeStart = 0;
			newSound->fadeTarget = 0;
		}
		newSound->tracks = (FACTTrackInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTTrackInstance) * newSound->sound->trackCount
		);
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			newSound->tracks[i].rpcData.rpcVolume = 0.0f;
			newSound->tracks[i].rpcData.rpcPitch = 0.0f;
			newSound->tracks[i].rpcData.rpcReverbSend = 0.0f;
			newSound->tracks[i].rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].evtVolume = 0.0f;
			newSound->tracks[i].evtPitch = 0.0f;

			newSound->tracks[i].activeWave.wave = NULL;
			newSound->tracks[i].activeWave.baseVolume = 0.0f;
			newSound->tracks[i].activeWave.basePitch = 0;
			newSound->tracks[i].activeWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].activeWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			newSound->tracks[i].upcomingWave.wave = NULL;
			newSound->tracks[i].upcomingWave.baseVolume = 0.0f;
			newSound->tracks[i].upcomingWave.basePitch = 0;
			newSound->tracks[i].upcomingWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].upcomingWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].events = (FACTEventInstance*) cue->parentBank->parentEngine->pMalloc(
				sizeof(FACTEventInstance) * newSound->sound->tracks[i].eventCount
			);
			for (j = 0; j < newSound->sound->tracks[i].eventCount; j += 1)
			{
				evt = &newSound->sound->tracks[i].events[j];

				newSound->tracks[i].events[j].timestamp =
					newSound->sound->tracks[i].events[j].timestamp;
				newSound->tracks[i].events[j].loopCount = 0;
				newSound->tracks[i].events[j].finished = 0;
				newSound->tracks[i].events[j].value = 0.0f;

				if (	evt->type == FACTEVENT_PLAYWAVE ||
					evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
					evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
					evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].wave.loopCount;

					evtInst = &newSound->tracks[i].events[j];
					if (	!evt->wave.isComplex ||
						(evt->wave.complex.variation & 0xF) == 0	)
					{
						evtInst->valuei = 0;
					}
					else
					{
						max = 0.0f;
						for (k = 0; k < evt->wave.complex.trackCount; k += 1)
						{
							max += evt->wave.complex.weights[k];
						}
						next = FACT_INTERNAL_rng() * max;
						for (k = evt->wave.complex.trackCount - 1; k >= 0; k -= 1)
						{
							if (next > (max - evt->wave.complex.weights[k]))
							{
								evtInst->valuei = k;
								break;
							}
							max -= evt->wave.complex.weights[k];
						}
					}
					FACT_INTERNAL_GetNextWave(
						cue,
						newSound->sound,
						&newSound->sound->tracks[i],
						&newSound->tracks[i],
						evt,
						evtInst
					);
					newSound->tracks[i].waveEvt = evt;
					newSound->tracks[i].waveEvtInst = evtInst;
				}
				else if (	evt->type == FACTEVENT_PITCHREPEATING ||
						evt->type == FACTEVENT_VOLUMEREPEATING	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].value.repeats;
				}
				else if (evt->type == FACTEVENT_MARKERREPEATING)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].marker.repeats;
				}
			}
		}

		/* Calculate Max RPC Release Time */
		cue->maxRpcReleaseTime = 0;
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			for (j = 0; j < newSound->sound->tracks[i].rpcCodeCount; j += 1)
			{
				rpc = FACT_INTERNAL_GetRPC(
					newSound->parentCue->parentBank->parentEngine,
					newSound->sound->tracks[i].rpcCodes[j]
				);
				if (	rpc->parameter == RPC_PARAMETER_VOLUME &&
					cue->parentBank->parentEngine->variables[rpc->variable].accessibility & 0x04	)
				{
					if (FAudio_strcmp(
						newSound->parentCue->parentBank->parentEngine->variableNames[rpc->variable],
						"ReleaseTime"
					) == 0) {
						lastX = rpc->points[rpc->pointCount - 1].x;
						if (lastX > cue->maxRpcReleaseTime)
						{
							cue->maxRpcReleaseTime = (uint32_t) lastX /* bleh */;
						}
					}
				}
			}
		}

		cue->playingSound = newSound;
	}

	return 1;
}